

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool google::protobuf::util::FieldMaskUtil::ToJsonString(FieldMask *mask,string *out)

{
  int iVar1;
  bool bVar2;
  Type *str;
  int index;
  StringPiece local_68;
  undefined1 local_58 [8];
  string camelcase_path;
  
  out->_M_string_length = 0;
  *(out->_M_dataplus)._M_p = '\0';
  camelcase_path.field_2._8_8_ = &mask->paths_;
  index = 0;
  do {
    iVar1 = (mask->paths_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 <= index) {
LAB_003219d8:
      return iVar1 <= index;
    }
    str = protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    ((RepeatedPtrFieldBase *)camelcase_path.field_2._8_8_,index);
    local_58 = (undefined1  [8])&camelcase_path._M_string_length;
    camelcase_path._M_dataplus._M_p = (pointer)0x0;
    camelcase_path._M_string_length._0_1_ = 0;
    StringPiece::StringPiece<std::allocator<char>>(&local_68,str);
    bVar2 = SnakeCaseToCamelCase(local_68,(string *)local_58);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)local_58);
      goto LAB_003219d8;
    }
    if (index != 0) {
      std::__cxx11::string::push_back((char)out);
    }
    std::__cxx11::string::append((string *)out);
    std::__cxx11::string::~string((string *)local_58);
    index = index + 1;
  } while( true );
}

Assistant:

bool FieldMaskUtil::ToJsonString(const FieldMask& mask, std::string* out) {
  out->clear();
  for (int i = 0; i < mask.paths_size(); ++i) {
    const std::string& path = mask.paths(i);
    std::string camelcase_path;
    if (!SnakeCaseToCamelCase(path, &camelcase_path)) {
      return false;
    }
    if (i > 0) {
      out->push_back(',');
    }
    out->append(camelcase_path);
  }
  return true;
}